

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

int Acb_FindArgMaxUnderMask(Vec_Wrd_t *vPats,word *Mask,Vec_Int_t *vWeights,int nPats)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  uVar4 = (ulong)vPats->nSize;
  iVar1 = -1;
  if (0xff < (long)uVar4) {
    uVar3 = ((nPats >> 6) + 1) - (uint)((nPats & 0x3fU) == 0);
    iVar8 = -1;
    lVar9 = 0;
    uVar11 = 0;
    uVar2 = 0xffffffff;
    do {
      if (uVar4 <= uVar11 << 8) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      if ((int)uVar3 < 1) {
        iVar6 = 0;
      }
      else {
        uVar10 = 0;
        iVar6 = 0;
        do {
          uVar7 = Mask[uVar10] & *(ulong *)((long)vPats->pArray + uVar10 * 8 + lVar9);
          uVar7 = uVar7 - (uVar7 >> 1 & 0x5555555555555555);
          uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
          uVar7 = (uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f;
          uVar7 = (uVar7 >> 8) + uVar7;
          lVar5 = (uVar7 >> 0x10) + uVar7;
          iVar6 = iVar6 + ((int)((ulong)lVar5 >> 0x20) + (int)lVar5 & 0xffU);
          uVar10 = uVar10 + 1;
        } while (uVar3 != uVar10);
      }
      if (iVar8 < iVar6) {
        uVar2 = uVar11 & 0xffffffff;
      }
      iVar1 = (int)uVar2;
      if (iVar8 <= iVar6) {
        iVar8 = iVar6;
      }
      uVar11 = uVar11 + 1;
      lVar9 = lVar9 + 0x800;
    } while (uVar11 != (uVar4 >> 8 & 0xffffff));
  }
  return iVar1;
}

Assistant:

int Acb_FindArgMaxUnderMask( Vec_Wrd_t * vPats, word Mask[NWORDS], Vec_Int_t * vWeights, int nPats )
{
    int nDivs = Vec_WrdSize(vPats)/NWORDS;
    int nWords = Abc_Bit6WordNum(nPats);
    int i, iBest = -1;
    int Cost, CostBest = -1;
    for ( i = 0; i < nDivs; i++ )
    {
        word * pPat = Vec_WrdEntryP(vPats, NWORDS*i);
        Cost = Abc_TtCountOnesVecMask(Mask, pPat, nWords, 0);
        if ( CostBest < Cost )
//        if ( CostBest == -1 || (float)CostBest/Cost < 0.6*(float)Vec_IntEntry(vWeights, iBest)/Vec_IntEntry(vWeights, i) )
//        if ( CostBest == -1 || (float)CostBest/Cost < 0.67*(float)Vec_IntEntry(vWeights, iBest)/Vec_IntEntry(vWeights, i) )
        {
            CostBest = Cost;
            iBest = i;
        }
    }
    return iBest;
}